

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Bool findNodeWithId(Node *node,TidyTagId tid)

{
  Bool BVar1;
  
  if (node != (Node *)0x0) {
    do {
      if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_MAIN)) ||
         ((node->content != (Node *)0x0 && (BVar1 = findNodeWithId(node->content,tid), BVar1 != no))
         )) {
        return yes;
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return no;
}

Assistant:

static Bool findNodeWithId( Node *node, TidyTagId tid )
{
    Node *content;
    while (node)
    {
        if (TagIsId(node,tid))
            return yes;
        /*\
         *   Issue #459 - Under certain circumstances, with many node this use of
         *   'for (content = node->content; content; content = content->content)'
         *   would produce a **forever** circle, or at least a very extended loop...
         *   It is sufficient to test the content, if it exists,
         *   to quickly iterate all nodes. Now all nodes are tested only once.
        \*/
        content = node->content;
        if (content)
        {
            if ( findNodeWithId(content,tid) )
                return yes;
        }
        node = node->next;
    }
    return no;
}